

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O1

MomentData * __thiscall
OpenMD::LDForceModifier::getMomentData(LDForceModifier *this,StuntDouble *sd)

{
  ulong *puVar1;
  double dVar2;
  double dVar3;
  uint i_1;
  iterator iVar4;
  MomentData *__s;
  iterator iVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong **ppuVar8;
  undefined1 *puVar9;
  uint i_2;
  undefined8 *puVar10;
  uint j;
  Mat3x3d *pMVar11;
  uint i;
  long lVar12;
  double tmp;
  double dVar13;
  undefined8 uVar14;
  RectMatrix<double,_3U,_3U> result_3;
  RectMatrix<double,_3U,_3U> result_2;
  SquareMatrix3<double> result_1;
  SquareMatrix<double,_3> m;
  RectMatrix<double,_3U,_3U> result;
  undefined1 local_1b8 [32];
  MomentData *local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  ulong *local_168;
  double dStack_160;
  ulong local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  (*sd->_vptr_StuntDouble[7])((key_type *)local_1b8);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
          ::find(&(this->momentsMap_)._M_t,(key_type *)local_1b8);
  puVar1 = (ulong *)(local_1b8 + 0x10);
  if ((ulong *)local_1b8._0_8_ != puVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(this->momentsMap_)._M_t._M_impl.super__Rb_tree_header) {
    __s = (MomentData *)operator_new(0xa8);
    memset(__s,0,0xa8);
    (*sd->_vptr_StuntDouble[7])((key_type *)local_1b8,sd);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
            ::find(&(this->hydroPropMap_)._M_t,(key_type *)local_1b8);
    if ((ulong *)local_1b8._0_8_ != puVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((_Rb_tree_header *)iVar5._M_node ==
        &(this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header) {
      (*sd->_vptr_StuntDouble[7])(local_1b8,sd);
      snprintf(painCave.errMsg,2000,
               "LDForceManager createMomentData: Couldn\'t find HydroProp for\nobject type %s!\n",
               local_1b8._0_8_);
      if ((ulong *)local_1b8._0_8_ != puVar1) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      lVar6 = *(long *)(iVar5._M_node + 2);
      dVar2 = *(double *)(lVar6 + 0x20);
      dVar13 = *(double *)(lVar6 + 0x28);
      (__s->rcr).super_Vector<double,_3U>.data_[2] = *(double *)(lVar6 + 0x30);
      (__s->rcr).super_Vector<double,_3U>.data_[0] = dVar2;
      (__s->rcr).super_Vector<double,_3U>.data_[1] = dVar13;
    }
    if (sd->objType_ == otRigidBody) {
      lVar12 = 0;
      lVar6 = __dynamic_cast(sd,&StuntDouble::typeinfo,&RigidBody::typeinfo,0);
      local_1b8._0_8_ = *(ulong **)(lVar6 + 0x140);
      local_1b8._8_8_ = *(double *)(lVar6 + 0x148);
      local_1b8._16_8_ = *(size_type *)(lVar6 + 0x150);
      do {
        (__s->rcr).super_Vector<double,_3U>.data_[lVar12] =
             (__s->rcr).super_Vector<double,_3U>.data_[lVar12] - *(double *)(local_1b8 + lVar12 * 8)
        ;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
    }
    dVar2 = sd->mass_;
    puVar9 = local_1b8;
    (*sd->_vptr_StuntDouble[5])();
    lVar6 = 0;
    do {
      *(undefined8 *)
       ((long)(__s->Icr).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar6 + 0x10) = *(undefined8 *)(local_1b8 + lVar6 + 0x10);
      uVar14 = *(undefined8 *)(local_1b8 + lVar6 + 8);
      puVar7 = (undefined8 *)
               ((long)(__s->Icr).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar6);
      *puVar7 = *(undefined8 *)(local_1b8 + lVar6);
      puVar7[1] = uVar14;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    dVar13 = 0.0;
    lVar6 = 0;
    do {
      dVar3 = (__s->rcr).super_Vector<double,_3U>.data_[lVar6];
      dVar13 = dVar13 + dVar3 * dVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    puVar7 = &local_c8;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_88 = 0;
    lVar6 = 0;
    do {
      lVar12 = 0;
      do {
        uVar14 = 0x3ff0000000000000;
        if (lVar6 != lVar12) {
          uVar14 = 0;
        }
        puVar7[lVar12] = uVar14;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar6 = lVar6 + 1;
      puVar7 = puVar7 + 3;
    } while (lVar6 != 3);
    puVar7 = &local_78;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_38 = 0;
    puVar10 = &local_c8;
    lVar6 = 0;
    do {
      lVar12 = 0;
      do {
        puVar7[lVar12] = (double)puVar10[lVar12] * dVar13;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar6 = lVar6 + 1;
      puVar7 = puVar7 + 3;
      puVar10 = puVar10 + 3;
    } while (lVar6 != 3);
    puVar7 = &local_118;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_d8 = 0;
    lVar6 = 0;
    do {
      dVar13 = (__s->rcr).super_Vector<double,_3U>.data_[lVar6];
      lVar12 = 0;
      do {
        puVar7[lVar12] = (__s->rcr).super_Vector<double,_3U>.data_[lVar12] * dVar13;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar6 = lVar6 + 1;
      puVar7 = puVar7 + 3;
    } while (lVar6 != 3);
    ppuVar8 = &local_168;
    local_138 = 0;
    uStack_130 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_168 = (ulong *)0x0;
    dStack_160 = 0.0;
    local_128 = 0;
    puVar7 = &local_118;
    puVar10 = &local_78;
    lVar6 = 0;
    do {
      lVar12 = 0;
      do {
        ppuVar8[lVar12] = (ulong *)((double)puVar10[lVar12] + (double)puVar7[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar6 = lVar6 + 1;
      ppuVar8 = ppuVar8 + 3;
      puVar7 = puVar7 + 3;
      puVar10 = puVar10 + 3;
    } while (lVar6 != 3);
    local_188 = 0.0;
    dStack_180 = 0.0;
    local_198 = (MomentData *)0x0;
    dStack_190 = 0.0;
    local_1b8._16_8_ = 0;
    local_1b8._24_8_ = 0;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = 0.0;
    local_178 = 0.0;
    ppuVar8 = &local_168;
    lVar6 = 0;
    do {
      lVar12 = 0;
      do {
        *(double *)(puVar9 + lVar12 * 8) = (double)ppuVar8[lVar12] * dVar2;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar6 = lVar6 + 1;
      puVar9 = puVar9 + 0x18;
      ppuVar8 = ppuVar8 + 3;
    } while (lVar6 != 3);
    puVar9 = local_1b8;
    lVar6 = 0;
    pMVar11 = &__s->Icr;
    do {
      lVar12 = 0;
      do {
        (pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar12] =
             *(double *)(puVar9 + lVar12 * 8) +
             (pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
             [lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar6 = lVar6 + 1;
      pMVar11 = (Mat3x3d *)
                ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
      puVar9 = puVar9 + 0x18;
    } while (lVar6 != 3);
    SquareMatrix3<double>::inverse((SquareMatrix3<double> *)local_1b8,&__s->Icr);
    lVar6 = 0;
    do {
      *(undefined8 *)
       ((long)(__s->IcrInv).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
       + lVar6 + 0x10) = *(undefined8 *)(local_1b8 + lVar6 + 0x10);
      uVar14 = *(undefined8 *)(local_1b8 + lVar6 + 8);
      puVar7 = (undefined8 *)
               ((long)(__s->IcrInv).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar6);
      *puVar7 = *(undefined8 *)(local_1b8 + lVar6);
      puVar7[1] = uVar14;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    (*sd->_vptr_StuntDouble[7])(&local_168,sd);
    if (local_168 == &local_158) {
      local_1b8._24_8_ = uStack_150;
      local_1b8._0_8_ = puVar1;
    }
    else {
      local_1b8._0_8_ = local_168;
    }
    local_1b8._16_8_ = local_158;
    local_1b8._8_8_ = dStack_160;
    dStack_160 = 0.0;
    local_158 = local_158 & 0xffffffffffffff00;
    local_198 = __s;
    local_168 = &local_158;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::MomentData*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::MomentData*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>>
                *)&this->momentsMap_,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>
                *)local_1b8);
    if ((ulong *)local_1b8._0_8_ != puVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,local_158 + 1);
    }
  }
  else {
    __s = *(MomentData **)(iVar4._M_node + 2);
  }
  return __s;
}

Assistant:

MomentData* LDForceModifier::getMomentData(StuntDouble* sd) {
    map<string, MomentData*>::iterator j = momentsMap_.find(sd->getType());
    if (j != momentsMap_.end()) {
      return j->second;
    } else {
      MomentData* moment                  = new MomentData;
      map<string, HydroProp*>::iterator i = hydroPropMap_.find(sd->getType());

      if (i != hydroPropMap_.end()) {
        // Center of Resistance:
        moment->rcr = i->second->getCenterOfResistance();
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LDForceManager createMomentData: Couldn't find HydroProp for\n"
            "object type %s!\n",
            sd->getType().c_str());
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      }

      if (sd->isRigidBody())
        moment->rcr -= dynamic_cast<RigidBody*>(sd)->getRefCOM();

      // Parallel axis formula to get the moment of inertia around
      // the center of resistance:
      RealType mass = sd->getMass();
      moment->Icr   = sd->getI();
      moment->Icr +=
          mass * (dot(moment->rcr, moment->rcr) * Mat3x3d::identity() +
                  outProduct(moment->rcr, moment->rcr));
      moment->IcrInv = moment->Icr.inverse();

      momentsMap_.insert(
          map<string, MomentData*>::value_type(sd->getType(), moment));
      return moment;
    }
  }